

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::not_equal::~not_equal(not_equal *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#t", run("(!= 12 13)"));
      TEST_EQ("#f", run("(!= 12 12)"));
      TEST_EQ("#t", run("(!= 12.1 13.1)"));
      TEST_EQ("#f", run("(!= 12.1 12.1)"));
      TEST_EQ("#t", run("(!= 12 13.1)"));
      TEST_EQ("#f", run("(!= 12 12.0)"));
      TEST_EQ("#t", run("(!= 12.0 13)"));
      TEST_EQ("#f", run("(!= 12.0 12)"));

      TEST_EQ("#f", run("(!= 12 12)"));
      TEST_EQ("#t", run("(!= 13 12)"));
      TEST_EQ("#t", run("(!= 16 (+ 13 1)) "));
      TEST_EQ("#f", run("(!= 16 (+ 13 3))"));
      TEST_EQ("#t", run("(!= 16 (+ 13 13))"));
      TEST_EQ("#t", run("(!= (+ 13 1) 16) "));
      TEST_EQ("#f", run("(!= (+ 13 3) 16) "));
      TEST_EQ("#t", run("(!= (+ 13 13) 16)"));

      TEST_EQ("#t", run("(!= 12.0 13)"));
      TEST_EQ("#f", run("(!= 12.0 12)"));
      TEST_EQ("#t", run("(!= 13.0 12)"));
      TEST_EQ("#t", run("(!= 16.0 (+ 13 1)) "));
      TEST_EQ("#f", run("(!= 16.0 (+ 13 3))"));
      TEST_EQ("#t", run("(!= 16.0 (+ 13 13))"));
      TEST_EQ("#t", run("(!= (+ 13.0 1) 16) "));
      TEST_EQ("#f", run("(!= (+ 13.0 3) 16.0) "));
      TEST_EQ("#t", run("(!= (+ 13.0 13.0) 16.0)"));

      TEST_EQ("#t", run("(!= 12 13 14 15 16 17 18 19 20 21 22 23)"));
      TEST_EQ("#t", run("(!= 12 13 14 15 16 17 18 19 20 21 22 12)"));
      }